

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfContextInit.cpp
# Opt level: O0

ContextInitializer * __thiscall
Imf_3_4::ContextInitializer::setOutputStream(ContextInitializer *this,OStream *ostr)

{
  void *pvVar1;
  ContextInitializer *in_RDI;
  OStream *in_stack_ffffffffffffffc8;
  
  pvVar1 = operator_new(0x38);
  ostream_holder::ostream_holder((ostream_holder *)in_RDI,in_stack_ffffffffffffffc8);
  (in_RDI->_initializer).user_data = pvVar1;
  (in_RDI->_initializer).read_fn = (exr_read_func_ptr_t)0x0;
  (in_RDI->_initializer).size_fn = (exr_query_size_func_ptr_t)0x0;
  (in_RDI->_initializer).write_fn = ostream_write;
  (in_RDI->_initializer).destroy_fn = ostream_destroy;
  in_RDI->_ctxt_type = WRITE;
  return in_RDI;
}

Assistant:

ContextInitializer&
ContextInitializer::setOutputStream (OStream* ostr)
{
    _initializer.user_data  = new ostream_holder{ostr};
    _initializer.read_fn    = nullptr;
    _initializer.size_fn    = nullptr;
    _initializer.write_fn   = ostream_write;
    _initializer.destroy_fn = ostream_destroy;
    _ctxt_type              = ContextFileType::WRITE;
    return *this;
}